

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Library::SetProperty(Library *this,String *name,Variant *value)

{
  iterator iVar1;
  shared_ptr<Jinx::Impl::Runtime> runtime;
  __shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::mutex::lock(&this->m_propertyMutex);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_4096UL,_16UL>_>
          ::find(&(this->m_propertyNameTable)._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->m_propertyNameTable)._M_t._M_impl.super__Rb_tree_header) {
    std::__shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,&this->m_runtime);
    if (local_38._M_ptr != (Runtime *)0x0) {
      Runtime::SetProperty(local_38._M_ptr,*(RuntimeID *)(iVar1._M_node + 2),value);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_propertyMutex);
  return;
}

Assistant:

inline_t void Library::SetProperty(const String & name, const Variant & value)
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		auto itr = m_propertyNameTable.find(name);
		if (itr == m_propertyNameTable.end())
			return;
		auto runtime = m_runtime.lock();
		if (!runtime)
			return;
		runtime->SetProperty(itr->second.GetId(), value);
	}